

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall google::protobuf::compiler::Parser::Consume(Parser *this,char *text,char *error)

{
  bool bVar1;
  allocator<char> local_41;
  string local_40;
  
  bVar1 = TryConsume(this,text);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,error,&local_41);
    AddError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return bVar1;
}

Assistant:

bool Parser::Consume(const char* text, const char* error) {
  if (TryConsume(text)) {
    return true;
  } else {
    AddError(error);
    return false;
  }
}